

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# livevar_analyse.hpp
# Opt level: O0

void __thiscall optimization::livevar_analyse::Livevar_Analyse::unroll_phi(Livevar_Analyse *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  VarId *__args;
  reference ppVar4;
  VarId *__args_1;
  VarId *pVVar5;
  pointer pIVar6;
  reference this_00;
  long in_RDI;
  VarId var;
  iterator __end5;
  iterator __begin5;
  set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_> *__range5;
  value_type *inst;
  int i;
  pair<const_int,_mir::inst::BasicBlk> *blkpair;
  iterator __end2;
  iterator __begin2;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *__range2;
  Var_Replace vp;
  VarId *in_stack_fffffffffffffd18;
  Var_Replace *in_stack_fffffffffffffd20;
  string *in_stack_fffffffffffffd28;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__u;
  Function *in_stack_fffffffffffffd30;
  mapped_type *in_stack_fffffffffffffd38;
  map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
  *in_stack_fffffffffffffd40;
  Function *in_stack_fffffffffffffd48;
  ostream *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd60;
  undefined1 in_stack_fffffffffffffd67;
  Timestamp *in_stack_fffffffffffffda8;
  ostream *in_stack_fffffffffffffdb0;
  map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
  local_218;
  Severity *in_stack_fffffffffffffe18;
  ostream *in_stack_fffffffffffffe20;
  int local_1a4;
  _Self local_198;
  _Self local_190;
  long local_188;
  MirFunction *in_stack_fffffffffffffe88;
  Var_Replace *in_stack_fffffffffffffe90;
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [120];
  time_point_sys_clock local_70;
  Timestamp local_68 [3];
  undefined1 local_9;
  
  local_9 = 0;
  AixLog::operator<<(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  AixLog::Tag::Tag((Tag *)0x1448d8);
  AixLog::operator<<(in_stack_fffffffffffffd50,(Tag *)in_stack_fffffffffffffd48);
  local_70.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  AixLog::Timestamp::Timestamp(local_68,&local_70);
  AixLog::operator<<(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
             ,(allocator<char> *)in_stack_fffffffffffffd50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd67,in_stack_fffffffffffffd60),in_stack_fffffffffffffd58
             ,(allocator<char> *)in_stack_fffffffffffffd50);
  AixLog::Function::Function
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,(string *)in_stack_fffffffffffffd20
             ,(size_t)in_stack_fffffffffffffd18);
  poVar3 = AixLog::operator<<(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  poVar3 = std::operator<<(poVar3," is unrolling phi for ");
  __args = (VarId *)std::operator<<(poVar3,(string *)(*(long *)(in_RDI + 0x68) + 8));
  std::ostream::operator<<(__args,std::endl<char,std::char_traits<char>>);
  AixLog::Function::~Function((Function *)in_stack_fffffffffffffd20);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  AixLog::Timestamp::~Timestamp(local_68);
  AixLog::Tag::~Tag((Tag *)0x144a8d);
  var_replace::Var_Replace::Var_Replace(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  local_188 = *(long *)(in_RDI + 0x68) + 0x68;
  local_190._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_fffffffffffffd18);
  local_198._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              *)in_stack_fffffffffffffd18);
  while( true ) {
    bVar1 = std::operator!=(&local_190,&local_198);
    if (!bVar1) break;
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x144b13);
    local_1a4 = 0;
    while( true ) {
      __args_1 = (VarId *)(long)local_1a4;
      pVVar5 = (VarId *)std::
                        vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                        ::size(&(ppVar4->second).inst);
      if (pVVar5 <= __args_1) break;
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::at((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            *)in_stack_fffffffffffffd20,(size_type)in_stack_fffffffffffffd18);
      pIVar6 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          0x144b93);
      iVar2 = (*(pIVar6->super_Displayable)._vptr_Displayable[1])();
      if (iVar2 == 7) {
        std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                  ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x144bd0);
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        insert((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                *)in_stack_fffffffffffffd40,(value_type *)in_stack_fffffffffffffd38);
        pIVar6 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x144c11);
        (*(pIVar6->super_Displayable)._vptr_Displayable[2])
                  (&local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
        local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)
             std::
             set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
             begin((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                    *)in_stack_fffffffffffffd18);
        local_218._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             std::
             set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
             end((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                  *)in_stack_fffffffffffffd18);
        while( true ) {
          bVar1 = std::operator!=((_Self *)&local_218._M_t._M_impl.super__Rb_tree_header._M_header.
                                            _M_left,
                                  (_Self *)&local_218._M_t._M_impl.super__Rb_tree_header._M_header.
                                            _M_parent);
          if (!bVar1) break;
          std::_Rb_tree_const_iterator<mir::inst::VarId>::operator*
                    ((_Rb_tree_const_iterator<mir::inst::VarId> *)0x144d9e);
          in_stack_fffffffffffffd40 = &local_218;
          mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
          std::
          map<mir::inst::VarId,_std::pair<int,_int>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::pair<int,_int>_>_>_>
          ::at(in_stack_fffffffffffffd40,(key_type *)in_stack_fffffffffffffd38);
          in_stack_fffffffffffffd38 =
               std::
               map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
               ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                     *)in_stack_fffffffffffffd40,(key_type *)in_stack_fffffffffffffd38);
          __u = &in_stack_fffffffffffffd38->inst;
          this_00 = std::
                    vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ::at((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                          *)in_stack_fffffffffffffd20,(size_type)in_stack_fffffffffffffd18);
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                    ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)0x144e2f)
          ;
          std::make_unique<mir::inst::AssignInst,mir::inst::VarId&,mir::inst::VarId&>
                    (__args,__args_1);
          in_stack_fffffffffffffd20 = (Var_Replace *)&stack0xfffffffffffffde0;
          std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
          unique_ptr<mir::inst::AssignInst,std::default_delete<mir::inst::AssignInst>,void>
                    (this_00,(unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                              *)__u);
          std::
          vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
          ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                       *)in_stack_fffffffffffffd20,(value_type *)in_stack_fffffffffffffd18);
          std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                    (this_00);
          std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
          ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>
                       *)in_stack_fffffffffffffd20);
          std::_Rb_tree_const_iterator<mir::inst::VarId>::operator++
                    ((_Rb_tree_const_iterator<mir::inst::VarId> *)in_stack_fffffffffffffd20);
        }
        std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>::
        ~set((set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
              *)0x144c8b);
      }
      local_1a4 = local_1a4 + 1;
    }
    std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
               in_stack_fffffffffffffd20);
  }
  var_replace::Var_Replace::~Var_Replace(in_stack_fffffffffffffd20);
  return;
}

Assistant:

void unroll_phi() {
    LOG(TRACE) << " is unrolling phi for " << func.name << std::endl;
    var_replace::Var_Replace vp(func);
    for (auto& blkpair : func.basic_blks) {
      for (auto i = 0; i < blkpair.second.inst.size(); ++i) {
        auto& inst = blkpair.second.inst.at(i);
        if (inst->inst_kind() == mir::inst::InstKind::Phi) {
          phi_dests.insert(inst->dest);
          for (auto var : inst->useVars()) {
            func.basic_blks.at(vp.defpoint.at(var).first)
                .inst.push_back(std::make_unique<mir::inst::AssignInst>(
                    blkpair.second.inst.at(i)->dest, var));
          }
        }
      }
    }
    // LOG(TRACE) << func << std::endl;
  }